

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O3

void __thiscall
icu_63::HebrewCalendar::validateField
          (HebrewCalendar *this,UCalendarDateFields field,UErrorCode *status)

{
  int iVar1;
  int iVar2;
  
  if (field == UCAL_MONTH) {
    iVar1 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x24])(this);
    iVar2 = (iVar1 * 0xc + 0x11) % 0x13;
    iVar1 = 0xc;
    if (iVar2 < 0) {
      iVar1 = -7;
    }
    if ((iVar2 < iVar1) && ((this->super_Calendar).fFields[2] == 5)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
  }
  Calendar::validateField(&this->super_Calendar,field,status);
  return;
}

Assistant:

void HebrewCalendar::validateField(UCalendarDateFields field, UErrorCode &status) {
    if (field == UCAL_MONTH && !isLeapYear(handleGetExtendedYear()) && internalGet(UCAL_MONTH) == ADAR_1) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    Calendar::validateField(field, status);
}